

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hand_rolled_vtable.hpp
# Opt level: O3

printable_vtable * __thiscall printable_vtable::operator=(printable_vtable *this)

{
  _func_void *p_Var1;
  void *pvVar2;
  printable_vtable local_78;
  printable_vtable local_48;
  
  local_78.vtable_._M_elems[2] = print_wrapper<hi_printable>::exec;
  local_78.vtable_._M_elems[0] = clone_impl<hi_printable>;
  local_78.vtable_._M_elems[1] = delete_impl<hi_printable>;
  local_78.value_ = (void *)0x0;
  local_48.vtable_._M_elems[2] = print_wrapper<hi_printable>::exec;
  local_48.vtable_._M_elems[0] = clone_impl<hi_printable>;
  local_48.vtable_._M_elems[1] = delete_impl<hi_printable>;
  local_48.get_value_ptr_ = get_value_ptr<false>;
  local_48.value_ = (void *)0x0;
  local_78.get_value_ptr_ = get_value_ptr<false>;
  operator=(&local_78,this);
  operator=(this,&local_48);
  p_Var1 = local_48.vtable_._M_elems[1];
  if (local_48.get_value_ptr_ == get_value_ptr<true>) {
    pvVar2 = get_value_ptr<true>(&local_48);
    (*p_Var1)(pvVar2);
  }
  p_Var1 = local_78.vtable_._M_elems[1];
  if (local_78.get_value_ptr_ == get_value_ptr<true>) {
    pvVar2 = get_value_ptr<true>(&local_78);
    (*p_Var1)(pvVar2);
  }
  return this;
}

Assistant:

printable_vtable & operator= (T value)
    {
        printable_vtable temp(std::move(value));
        std::swap(temp, *this);
        return *this;
    }